

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::walkStacklessTreeAgainstRay
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  uint *puVar9;
  cbtOptimizedBvhNode *pcVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  ulong uVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined8 local_e8;
  float afStack_e0 [2];
  undefined8 local_d8;
  float fStack_d0;
  undefined4 uStack_cc;
  uint *local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  uint *local_a0;
  uint *local_98;
  cbtNodeOverlapCallback *local_90;
  cbtVector3 *local_88;
  float *local_80;
  float *local_78;
  uint *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar15 [16];
  
  if (this->m_curNodeIndex < 1) {
    iVar12 = 0;
  }
  else {
    fVar1 = raySource->m_floats[2];
    fVar28 = rayTarget->m_floats[2];
    pcVar10 = (this->m_contiguousNodes).m_data;
    auVar15 = vminss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar1));
    fVar2 = fVar28 - fVar1;
    auVar32 = vmaxss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar1));
    local_a8 = auVar32._0_4_ + aabbMax->m_floats[2];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)raySource->m_floats;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)rayTarget->m_floats;
    local_a4 = auVar15._0_4_ + aabbMin->m_floats[2];
    auVar15 = vsubps_avx(auVar22,auVar19);
    auVar16 = vmovshdup_avx(auVar22);
    auVar20 = vmovshdup_avx(auVar19);
    auVar32 = vmovshdup_avx(auVar15);
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar32._0_4_)),auVar15,auVar15);
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    fVar28 = 1.0 / auVar32._0_4_;
    fVar1 = fVar2 * fVar28;
    auVar30._0_4_ = fVar28 * auVar15._0_4_;
    auVar30._4_4_ = fVar28 * auVar15._4_4_;
    auVar30._8_4_ = fVar28 * auVar15._8_4_;
    auVar30._12_4_ = fVar28 * auVar15._12_4_;
    auVar32._0_4_ = auVar30._0_4_ * auVar15._0_4_;
    auVar32._4_4_ = auVar30._4_4_ * auVar15._4_4_;
    auVar32._8_4_ = auVar30._8_4_ * auVar15._8_4_;
    auVar32._12_4_ = auVar30._12_4_ * auVar15._12_4_;
    auVar32 = vmovshdup_avx(auVar32);
    auVar32 = vfmadd231ss_fma(auVar32,auVar30,auVar15);
    auVar27._8_4_ = 0x3f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar27._12_4_ = 0x3f800000;
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
    auVar33 = ZEXT1664(auVar32);
    uVar14 = vcmpps_avx512vl(auVar30,ZEXT816(0),0);
    auVar15 = vminss_avx(auVar22,auVar19);
    auVar32 = vmaxss_avx(auVar22,auVar19);
    local_b4 = auVar32._0_4_ + aabbMax->m_floats[0];
    auVar32 = vmaxss_avx(auVar16,auVar20);
    local_b8 = auVar32._0_4_ + aabbMax->m_floats[1];
    auVar32 = vdivps_avx(auVar27,auVar30);
    auVar6._12_4_ = 0;
    auVar6._0_12_ = ZEXT412(0);
    auVar31 = ZEXT1264(ZEXT412(0)) << 0x20;
    auVar16 = vminss_avx(auVar16,auVar20);
    local_b0 = auVar16._0_4_ + aabbMin->m_floats[1];
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar6 << 0x20,0);
    bVar13 = (bool)((byte)uVar4 & 1);
    local_ac = auVar15._0_4_ + aabbMin->m_floats[0];
    fVar1 = (float)((uint)bVar13 * 0x5d5e0b6b + (uint)!bVar13 * (int)(1.0 / fVar1));
    auVar29 = ZEXT464((uint)fVar1);
    auVar15 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar13 = (bool)((byte)uVar14 & 1);
    auVar16._0_4_ = (float)((uint)bVar13 * auVar15._0_4_ | (uint)!bVar13 * auVar32._0_4_);
    bVar13 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar13 * auVar15._4_4_ | (uint)!bVar13 * auVar32._4_4_;
    bVar13 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar13 * auVar15._8_4_ | (uint)!bVar13 * auVar32._8_4_;
    bVar13 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar13 * auVar15._12_4_ | (uint)!bVar13 * auVar32._12_4_;
    auVar34 = ZEXT1664(auVar16);
    auVar32 = vmovshdup_avx(auVar16);
    iVar12 = 0;
    iVar11 = 0;
    local_a0 = (uint *)(&local_e8 + (ulong)(0.0 <= auVar16._0_4_) * 2);
    local_98 = (uint *)(&local_e8 + (ulong)(auVar16._0_4_ < 0.0) * 2);
    local_80 = afStack_e0 + (ulong)(fVar1 < 0.0) * 4;
    local_78 = afStack_e0 + (ulong)(0.0 <= fVar1) * 4;
    local_70 = (uint *)((long)&local_e8 + (ulong)(auVar32._0_4_ < 0.0) * 0x10 + 4);
    puVar9 = (uint *)((long)&local_e8 + (ulong)(0.0 <= auVar32._0_4_) * 0x10 + 4);
    local_c0 = puVar9;
    local_88 = raySource;
    local_90 = nodeCallback;
    do {
      uVar4 = *(undefined8 *)((pcVar10->m_aabbMinOrg).m_floats + 2);
      bVar13 = true;
      uVar7 = *(undefined8 *)((pcVar10->m_aabbMaxOrg).m_floats + 2);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)aabbMax->m_floats;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(pcVar10->m_aabbMinOrg).m_floats;
      auVar32 = vsubps_avx(auVar23,auVar15);
      local_e8 = vmovlps_avx(auVar32);
      afStack_e0[0] = (float)uVar4;
      afStack_e0[1] = (float)((ulong)uVar4 >> 0x20);
      afStack_e0[0] = afStack_e0[0] - aabbMax->m_floats[2];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)aabbMin->m_floats;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(pcVar10->m_aabbMaxOrg).m_floats;
      auVar32 = vsubps_avx(auVar24,auVar20);
      local_d8 = vmovlps_avx(auVar32);
      fStack_d0 = (float)uVar7;
      _fStack_d0 = CONCAT44((int)((ulong)uVar7 >> 0x20),fStack_d0 - aabbMin->m_floats[2]);
      if ((local_ac <= (pcVar10->m_aabbMaxOrg).m_floats[0]) &&
         (bVar13 = true, (pcVar10->m_aabbMinOrg).m_floats[0] <= local_b4)) {
        bVar13 = false;
      }
      bVar8 = true;
      if ((local_a4 <= (pcVar10->m_aabbMaxOrg).m_floats[2]) &&
         ((pcVar10->m_aabbMinOrg).m_floats[2] <= local_a8)) {
        bVar8 = bVar13;
      }
      if (((pcVar10->m_aabbMaxOrg).m_floats[1] < local_b0) ||
         (bVar8 || local_b8 < (pcVar10->m_aabbMinOrg).m_floats[1])) {
LAB_008a7540:
        bVar13 = pcVar10->m_escapeIndex == -1;
        uVar14 = 0;
LAB_008a7549:
        if ((bVar13) || ((uVar14 & 1) != 0)) goto LAB_008a770c;
        iVar11 = iVar11 + pcVar10->m_escapeIndex;
        pcVar10 = pcVar10 + pcVar10->m_escapeIndex;
      }
      else {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)local_88->m_floats;
        auVar32 = vinsertps_avx(ZEXT416(*local_98),ZEXT416(*puVar9),0x10);
        auVar32 = vsubps_avx(auVar32,auVar25);
        auVar21._0_4_ = auVar34._0_4_ * auVar32._0_4_;
        auVar21._4_4_ = auVar34._4_4_ * auVar32._4_4_;
        auVar21._8_4_ = auVar34._8_4_ * auVar32._8_4_;
        auVar21._12_4_ = auVar34._12_4_ * auVar32._12_4_;
        auVar32 = vmovshdup_avx(auVar21);
        if (auVar32._0_4_ < auVar21._0_4_) goto LAB_008a7540;
        auVar15 = vinsertps_avx(ZEXT416(*local_a0),ZEXT416(*local_70),0x10);
        auVar15 = vsubps_avx(auVar15,auVar25);
        auVar26._0_4_ = auVar34._0_4_ * auVar15._0_4_;
        auVar26._4_4_ = auVar34._4_4_ * auVar15._4_4_;
        auVar26._8_4_ = auVar34._8_4_ * auVar15._8_4_;
        auVar26._12_4_ = auVar34._12_4_ * auVar15._12_4_;
        auVar15 = vmovshdup_avx(auVar26);
        if (auVar26._0_4_ < auVar15._0_4_) goto LAB_008a7540;
        auVar16 = vshufps_avx(auVar26,auVar26,0xe1);
        uVar14 = vcmpps_avx512vl(auVar21,auVar16,1);
        auVar17._4_12_ = auVar21._4_12_;
        auVar17._0_4_ =
             (float)((uint)((byte)uVar14 & 1) * (int)auVar15._0_4_ +
                    (uint)!(bool)((byte)uVar14 & 1) * (int)auVar21._0_4_);
        fVar1 = auVar29._0_4_ * (*local_78 - local_88->m_floats[2]);
        if (fVar1 < auVar17._0_4_) goto LAB_008a7540;
        bVar5 = (byte)(uVar14 >> 1);
        auVar18._4_12_ = auVar26._4_12_;
        auVar18._0_4_ =
             (float)((uint)(bVar5 & 1) * (int)auVar32._0_4_ +
                    (uint)!(bool)(bVar5 & 1) * (int)auVar26._0_4_);
        fVar28 = auVar29._0_4_ * (*local_80 - local_88->m_floats[2]);
        if (auVar18._0_4_ < fVar28) goto LAB_008a7540;
        auVar32 = vmaxss_avx(ZEXT416((uint)fVar28),auVar17);
        auVar15 = vminss_avx(ZEXT416((uint)fVar1),auVar18);
        local_48 = auVar33._0_16_;
        uVar14 = vcmpps_avx512vl(auVar32,local_48,1);
        uVar3 = vcmpps_avx512vl(auVar31._0_16_,auVar15,1);
        uVar14 = uVar14 & uVar3;
        bVar13 = pcVar10->m_escapeIndex == -1;
        puVar9 = local_c0;
        if (((uVar14 & 1) == 0) || (pcVar10->m_escapeIndex != -1)) goto LAB_008a7549;
        local_58 = auVar34._0_16_;
        local_68 = auVar29._0_16_;
        (*local_90->_vptr_cbtNodeOverlapCallback[2])
                  (local_90,(ulong)(uint)pcVar10->m_subPart,(ulong)(uint)pcVar10->m_triangleIndex);
        auVar29 = ZEXT1664(local_68);
        auVar34 = ZEXT1664(local_58);
        auVar33 = ZEXT1664(local_48);
        auVar31 = ZEXT1664(ZEXT816(0) << 0x40);
        puVar9 = local_c0;
LAB_008a770c:
        pcVar10 = pcVar10 + 1;
        iVar11 = iVar11 + 1;
      }
      iVar12 = iVar12 + 1;
    } while (iVar11 < this->m_curNodeIndex);
  }
  if (maxIterations < iVar12) {
    maxIterations = iVar12;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessTreeAgainstRay(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(!m_useQuantization);

	const cbtOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap = 0;
	unsigned rayBoxOverlap = 0;
	cbtScalar lambda_max = 1.0;

	/* Quick pruning by quantized box */
	cbtVector3 rayAabbMin = raySource;
	cbtVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

#ifdef RAYAABB2
	cbtVector3 rayDir = (rayTarget - raySource);
	rayDir.normalize();
	lambda_max = rayDir.dot(rayTarget - raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	cbtVector3 rayDirectionInverse;
	rayDirectionInverse[0] = rayDir[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[0];
	rayDirectionInverse[1] = rayDir[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[1];
	rayDirectionInverse[2] = rayDir[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[2];
	unsigned int sign[3] = {rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};
#endif

	cbtVector3 bounds[2];

	while (curIndex < m_curNodeIndex)
	{
		cbtScalar param = 1.0;
		//catch bugs in tree data
		cbtAssert(walkIterations < m_curNodeIndex);

		walkIterations++;

		bounds[0] = rootNode->m_aabbMinOrg;
		bounds[1] = rootNode->m_aabbMaxOrg;
		/* Add box cast extents */
		bounds[0] -= aabbMax;
		bounds[1] -= aabbMin;

		aabbOverlap = TestAabbAgainstAabb2(rayAabbMin, rayAabbMax, rootNode->m_aabbMinOrg, rootNode->m_aabbMaxOrg);
		//perhaps profile if it is worth doing the aabbOverlap test first

#ifdef RAYAABB2
		///careful with this check: need to check division by zero (above) and fix the unQuantize method
		///thanks Joerg/hiker for the reproduction case!
		///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858
		rayBoxOverlap = aabbOverlap ? cbtRayAabb2(raySource, rayDirectionInverse, sign, bounds, param, 0.0f, lambda_max) : false;

#else
		cbtVector3 normal;
		rayBoxOverlap = cbtRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif

		isLeafNode = rootNode->m_escapeIndex == -1;

		//PCK: unsigned instead of bool
		if (isLeafNode && (rayBoxOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart, rootNode->m_triangleIndex);
		}

		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}